

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

Status sentencepiece::SentencePieceTrainer::Train
                 (string_view args,SentenceIterator *sentence_iterator,
                 string *serialized_model_proto)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  const_pointer pvVar5;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  SentenceIterator *unaff_retaddr;
  NormalizerSpec *in_stack_00000008;
  NormalizerSpec *in_stack_00000010;
  TrainerSpec *in_stack_00000018;
  NormalizerSpec denormalizer_spec;
  NormalizerSpec normalizer_spec;
  TrainerSpec trainer_spec;
  Status *_status;
  NormalizerSpec *in_stack_000004a8;
  NormalizerSpec *in_stack_000004b0;
  TrainerSpec *in_stack_000004b8;
  string_view in_stack_000004c0;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  TrainerSpec *in_stack_fffffffffffffd50;
  Die local_29 [17];
  basic_string_view<char,_std::char_traits<char>_> local_18;
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> serialized_model_proto_00;
  
  serialized_model_proto_00._M_head_impl =
       (Rep *)in_RDI._M_t.
              super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              ._M_t.
              super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
              .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
  iVar2 = logging::GetMinLogLevel();
  if (iVar2 < 1) {
    error::Die::Die(local_29,false);
    pcVar3 = logging::BaseName((char *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48)
                              );
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb2);
    poVar4 = std::operator<<(poVar4,") ");
    poVar4 = std::operator<<(poVar4,"LOG(");
    poVar4 = std::operator<<(poVar4,"INFO");
    poVar4 = std::operator<<(poVar4,") ");
    poVar4 = std::operator<<(poVar4,"Running command: ");
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
    in_stack_fffffffffffffd50 = (TrainerSpec *)std::operator<<(poVar4,pvVar5);
    error::Die::operator&(local_29,(ostream *)in_stack_fffffffffffffd50);
    error::Die::~Die((Die *)in_stack_fffffffffffffd50);
  }
  TrainerSpec::TrainerSpec((TrainerSpec *)0x4d1b38);
  NormalizerSpec::NormalizerSpec((NormalizerSpec *)0x4d1b45);
  NormalizerSpec::NormalizerSpec((NormalizerSpec *)0x4d1b54);
  MergeSpecsFromArgs(in_stack_000004c0,in_stack_000004b8,in_stack_000004b0,in_stack_000004a8);
  bVar1 = util::Status::ok((Status *)0x4d1ba5);
  if (bVar1) {
    util::Status::~Status((Status *)0x4d1c8a);
    Train(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
          (string *)serialized_model_proto_00._M_head_impl);
  }
  NormalizerSpec::~NormalizerSpec((NormalizerSpec *)in_stack_fffffffffffffd50);
  NormalizerSpec::~NormalizerSpec((NormalizerSpec *)in_stack_fffffffffffffd50);
  TrainerSpec::~TrainerSpec(in_stack_fffffffffffffd50);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::Train(absl::string_view args,
                                         SentenceIterator *sentence_iterator,
                                         std::string *serialized_model_proto) {
  LOG(INFO) << "Running command: " << args.data();
  TrainerSpec trainer_spec;
  NormalizerSpec normalizer_spec;
  NormalizerSpec denormalizer_spec;
  RETURN_IF_ERROR(MergeSpecsFromArgs(args, &trainer_spec, &normalizer_spec,
                                     &denormalizer_spec));
  return Train(trainer_spec, normalizer_spec, denormalizer_spec,
               sentence_iterator, serialized_model_proto);
}